

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

void ecs_bitset_set(ecs_bitset_t *bs,int32_t elem,_Bool value)

{
  byte bVar1;
  uint64_t v;
  int32_t lo;
  int32_t hi;
  _Bool value_local;
  int32_t elem_local;
  ecs_bitset_t *bs_local;
  
  _ecs_assert(elem < bs->count,2,(char *)0x0,"elem < bs->count",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/bitset.c"
              ,0x3b);
  if (elem < bs->count) {
    bVar1 = (byte)elem & 0x3f;
    bs->data[elem >> 6] =
         bs->data[elem >> 6] & (1L << bVar1 ^ 0xffffffffffffffffU) | (ulong)value << bVar1;
    return;
  }
  __assert_fail("elem < bs->count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/bitset.c"
                ,0x3b,"void ecs_bitset_set(ecs_bitset_t *, int32_t, _Bool)");
}

Assistant:

void ecs_bitset_set(
    ecs_bitset_t *bs,
    int32_t elem,
    bool value)
{
    ecs_assert(elem < bs->count, ECS_INVALID_PARAMETER, NULL);
    int32_t hi = elem >> 6;
    int32_t lo = elem & 0x3F;
    uint64_t v = bs->data[hi];
    bs->data[hi] = (v & ~((uint64_t)1 << lo)) | ((uint64_t)value << lo);
}